

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::VarExtend::add_source(VarExtend *this,shared_ptr<kratos::AssignStmt> *param_1)

{
  initializer_list<kratos::IRNode_*> __l;
  remove_reference_t<std::__cxx11::basic_string<char>_> *this_00;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args;
  char (*format_str) [48];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str_00;
  format_args args_00;
  allocator<kratos::IRNode_*> local_119;
  Var *local_118;
  Var **local_110;
  size_type local_108;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_100;
  v7 local_d8 [32];
  string local_b8;
  shared_ptr<kratos::AssignStmt> *local_98;
  shared_ptr<kratos::AssignStmt> *param_1_local;
  VarExtend *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_98 = param_1;
  param_1_local = (shared_ptr<kratos::AssignStmt> *)this;
  this_00 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)__cxa_allocate_exception(0x10);
  args = this_00;
  (*(this->parent_->super_IRNode)._vptr_IRNode[0x1f])(local_d8);
  local_38 = &local_b8;
  local_40 = "Cannot add source to an extended variable ({0})";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_d8;
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string,char[48],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"Cannot add source to an extended variable ({0})",(v7 *)vargs,format_str,args);
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  format_str_00.size_ = (size_t)this_local;
  format_str_00.data_ = (char *)local_78.size_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_80.values_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)local_78.data_,format_str_00,args_00);
  local_118 = this->parent_;
  local_110 = &local_118;
  local_108 = 1;
  std::allocator<kratos::IRNode_*>::allocator(&local_119);
  __l._M_len = local_108;
  __l._M_array = (iterator)local_110;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
            (&local_100,__l,&local_119);
  StmtException::StmtException((StmtException *)this_00,&local_b8,&local_100);
  __cxa_throw(this_00,&StmtException::typeinfo,StmtException::~StmtException);
}

Assistant:

void VarExtend::add_source(const std::shared_ptr<AssignStmt> &) {
    throw StmtException(
        ::format("Cannot add source to an extended variable ({0})", parent_->to_string()),
        {parent_});
}